

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O0

void __thiscall CodeGenerator::writeSignalImplDefine(CodeGenerator *this,ostream *s,Class *clazz)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference pSVar4;
  char *pcVar5;
  undefined1 *puVar6;
  string local_80 [8];
  string name;
  Property *prop;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Property,_std::allocator<Property>_> *__range1_1;
  Signal *sig;
  iterator __end1;
  iterator __begin1;
  vector<Signal,_std::allocator<Signal>_> *__range1;
  Class *clazz_local;
  ostream *s_local;
  CodeGenerator *this_local;
  
  poVar3 = std::operator<<(s,"// Signal definitions");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"#define RENGINE_DEFINE_SIGNALS_");
  poVar3 = std::operator<<(poVar3,(string *)clazz);
  poVar3 = std::operator<<(poVar3," \\");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<Signal,_std::allocator<Signal>_>::begin(&clazz->signals);
  sig = (Signal *)std::vector<Signal,_std::allocator<Signal>_>::end(&clazz->signals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Signal_*,_std::vector<Signal,_std::allocator<Signal>_>_>
                                *)&sig);
    if (!bVar1) break;
    pSVar4 = __gnu_cxx::__normal_iterator<Signal_*,_std::vector<Signal,_std::allocator<Signal>_>_>::
             operator*(&__end1);
    poVar3 = std::operator<<(s,"    rengine::Signal<");
    poVar3 = std::operator<<(poVar3,(string *)&pSVar4->signature);
    poVar3 = std::operator<<(poVar3,"> ");
    poVar3 = std::operator<<(poVar3,(string *)clazz);
    poVar3 = std::operator<<(poVar3,"::");
    poVar3 = std::operator<<(poVar3,(string *)&pSVar4->name);
    std::operator<<(poVar3,";");
    __gnu_cxx::__normal_iterator<Signal_*,_std::vector<Signal,_std::allocator<Signal>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<Property,_std::allocator<Property>_>::begin(&clazz->properties);
  prop = (Property *)std::vector<Property,_std::allocator<Property>_>::end(&clazz->properties);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>
                        *)&prop);
    if (!bVar1) break;
    name.field_2._8_8_ =
         __gnu_cxx::__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>
         ::operator*(&__end1_1);
    std::__cxx11::string::string(local_80,(string *)&((reference)name.field_2._8_8_)->name);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_80);
    iVar2 = toupper((int)*pcVar5);
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_80);
    *puVar6 = (char)iVar2;
    poVar3 = std::operator<<(s,"    rengine::Signal<> ");
    poVar3 = std::operator<<(poVar3,(string *)clazz);
    poVar3 = std::operator<<(poVar3,"::on");
    poVar3 = std::operator<<(poVar3,local_80);
    poVar3 = std::operator<<(poVar3,"Changed;");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_80);
    __gnu_cxx::__normal_iterator<Property_*,_std::vector<Property,_std::allocator<Property>_>_>::
    operator++(&__end1_1);
  }
  std::ostream::operator<<(s,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CodeGenerator::writeSignalImplDefine(std::ostream &s, Class *clazz)
{
    // ### Won't work with classes in namespaces, but then again, that will
    // need changes all around..
    s << "// Signal definitions" << std::endl
      << "#define RENGINE_DEFINE_SIGNALS_" << clazz->name << " \\" << std::endl;
    for (const Signal &sig : clazz->signals)
        s << "    rengine::Signal<" << sig.signature << "> " << clazz->name << "::" << sig.name << ";";
    for (const Property &prop : clazz->properties) {
        std::string name = prop.name;
        name[0] = std::toupper(name[0]);
        s << "    rengine::Signal<> " << clazz->name << "::on" << name << "Changed;" << std::endl;
    }
    // for (const Replicator &r : clazz->replicators)
    //     s << "    rengine::Signal<> " << clazz->name << "::Replicator_" << r.id << "::onCountChanged;";

    s << std::endl;
}